

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O3

Barcode * __thiscall
ZXing::OneD::Code39Reader::decodePattern
          (Barcode *__return_storage_ptr__,Code39Reader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  ushort *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Iterator puVar8;
  _Alloc_hider _Var9;
  Iterator puVar10;
  ushort uVar11;
  long lVar12;
  ulong uVar13;
  anon_class_16_2_7a905435 isGuard;
  char shiftChars [5];
  uint local_134;
  string txt;
  string fullASCII;
  PatternView local_e8;
  undefined7 local_c8;
  undefined1 uStack_c1;
  undefined2 uStack_c0;
  undefined1 uStack_be;
  undefined5 uStack_bd;
  Error local_b8;
  string local_88;
  FixedSparcePattern<CHAR_LEN,_6> START_PATTERN;
  undefined8 local_3f;
  undefined4 local_37;
  undefined2 local_33;
  undefined1 local_31;
  
  iVar7 = -(uint)(((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
                 (undefined1  [12])0x0);
  START_PATTERN._data[0] = 0;
  START_PATTERN._data[1] = 2;
  START_PATTERN._data[2] = 3;
  START_PATTERN._data[3] = 5;
  START_PATTERN._data[4] = 7;
  START_PATTERN._data[5] = 8;
  START_PATTERN._data[6] = 0;
  START_PATTERN._data[7] = 0;
  START_PATTERN._data[8] = 0;
  isGuard.minQuietZone = 6.0;
  isGuard.pattern = (FixedPattern<9,_6,_true> *)param_3;
  FindLeftGuard<9,ZXing::FindLeftGuard<9,6,true>(ZXing::PatternView_const&,int,ZXing::FixedPattern<9,6,true>const&,double)::_lambda(ZXing::PatternView_const&,int)_1_>
            (&local_e8,(ZXing *)next,(PatternView *)(ulong)(uint)((iVar7 + 4) * 9),
             (int)&START_PATTERN,isGuard);
  next->_base = (Iterator)CONCAT71(local_e8._base._1_7_,local_e8._base._0_1_);
  next->_end = (Iterator)
               CONCAT17(local_e8._end._7_1_,
                        CONCAT25(local_e8._end._5_2_,
                                 CONCAT41(local_e8._end._1_4_,local_e8._end._0_1_)));
  next->_data = local_e8._data;
  next->_size = local_e8._size;
  *(undefined4 *)&next->field_0xc = local_e8._12_4_;
  puVar10 = next->_data;
  if (((puVar10 == (Iterator)0x0) || (puVar10 < next->_base)) ||
     (next->_end < puVar10 + next->_size)) {
LAB_0015b9b9:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar6 = RowReader::NarrowWideBitPattern(next);
  cVar5 = RowReader::LookupBitPattern<int[44],char[45]>
                    (iVar6,(int (*) [44])CHARACTER_ENCODINGS,
                     (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*");
  if (cVar5 != '*') goto LAB_0015b9b9;
  puVar10 = next->_data;
  puVar8 = next->_base;
  if (puVar8 == puVar10) {
    local_134 = 0;
  }
  else {
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *puVar8;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar10);
    local_134 = (uint)uVar11;
  }
  if ((long)next->_size == 0) {
    uVar11 = 0;
  }
  else {
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *(short *)((long)puVar10 + lVar12);
      lVar12 = lVar12 + 2;
    } while ((long)next->_size * 2 != lVar12);
    uVar11 = uVar11 >> 1;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&txt);
  do {
    if (next->_data == (Iterator)0x0) goto LAB_0015bb20;
    lVar12 = (long)next->_size;
    puVar1 = next->_data + lVar12;
    next->_data = puVar1;
    if (((next->_end < puVar1 + lVar12) ||
        (next->_data = puVar1 + 1, next->_end < puVar1 + lVar12 + 1)) || (uVar11 < *puVar1))
    goto LAB_0015bb20;
    iVar6 = RowReader::NarrowWideBitPattern(next);
    RowReader::LookupBitPattern<int[44],char[45]>
              (iVar6,(int (*) [44])CHARACTER_ENCODINGS,
               (char (*) [45])"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*");
    std::__cxx11::string::push_back((char)&txt);
    if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015bb20;
  } while (txt._M_dataplus._M_p[txt._M_string_length - 1] != '*');
  std::__cxx11::string::pop_back();
  if ((int)txt._M_string_length < iVar7 + 2) {
LAB_0015bb20:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    goto LAB_0015bb37;
  }
  iVar7 = next->_size;
  puVar1 = next->_data + iVar7;
  if ((puVar1 != next->_end + -1) && (iVar7 != 0)) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *(short *)((long)next->_data + lVar12);
      lVar12 = lVar12 + 2;
    } while ((long)iVar7 * 2 != lVar12);
    if ((float)*puVar1 < (float)uVar11 * 0.5) goto LAB_0015bb20;
  }
  cVar5 = txt._M_dataplus._M_p[txt._M_string_length - 1];
  std::__cxx11::string::pop_back();
  iVar7 = TransformReduce<std::__cxx11::string,int,ZXing::OneD::Code39Reader::decodePattern(int,ZXing::PatternView&,std::unique_ptr<ZXing::OneD::RowReader::DecodingState,std::default_delete<ZXing::OneD::RowReader::DecodingState>>&)const::__1>
                    (txt._M_dataplus._M_p,txt._M_string_length);
  cVar3 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ-. $/+%*"[iVar7 % 0x2b];
  if (cVar5 != cVar3) {
    std::__cxx11::string::push_back((char)&txt);
  }
  builtin_strncpy(shiftChars,"$%/+",5);
  if ((undefined1  [12])((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x20)
      == (undefined1  [12])0x0) {
    fullASCII._M_dataplus._M_p = (pointer)&fullASCII.field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,txt._M_dataplus._M_p,txt._M_dataplus._M_p + txt._M_string_length)
    ;
    DecodeCode39AndCode93FullASCII(&fullASCII,&local_88,shiftChars);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((fullASCII._M_string_length == 0) || (txt._M_string_length == 0)) {
LAB_0015bcf3:
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    _Var9._M_p = txt._M_dataplus._M_p;
    do {
      lVar12 = 0;
      do {
        if (*_Var9._M_p == shiftChars[lVar12]) {
          if (_Var9._M_p == txt._M_dataplus._M_p + txt._M_string_length) goto LAB_0015bcf3;
          uVar13 = 2;
          std::__cxx11::string::_M_assign((string *)&txt);
          goto LAB_0015bcf6;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      _Var9._M_p = _Var9._M_p + 1;
    } while (_Var9._M_p != txt._M_dataplus._M_p + txt._M_string_length);
  }
LAB_0015bcf6:
  if (cVar5 == cVar3) {
    std::__cxx11::string::push_back((char)&txt);
LAB_0015bd15:
    uStack_be = 0;
    uStack_bd = 0;
    local_e8._base._1_7_ = 0;
    local_e8._end._0_1_ = 0;
    local_e8._end._1_4_ = 0;
    local_e8._end._5_2_ = 0;
    local_e8._end._7_1_ = 0;
    local_c8 = 0;
    uStack_c0 = 0xffff;
  }
  else {
    if ((undefined1  [12])
        ((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x40) ==
        (undefined1  [12])0x0) goto LAB_0015bd15;
    local_e8._base._1_7_ = (undefined7)local_3f;
    local_e8._end._0_1_ = (undefined1)((ulong)local_3f >> 0x38);
    local_e8._end._1_4_ = local_37;
    local_e8._end._5_2_ = local_33;
    local_e8._end._7_1_ = local_31;
    local_c8 = 0x19676e;
    uStack_c0 = 0x84;
    uStack_be = 2;
  }
  uStack_c1 = 0;
  local_e8._base._0_1_ = 0;
  local_e8._size = 0;
  local_e8._12_4_ = 0;
  local_e8._data = (Iterator)&local_e8._base;
  puVar10 = next->_base;
  if (puVar10 == next->_data + next->_size) {
    iVar7 = -1;
  }
  else {
    uVar11 = 0;
    do {
      uVar11 = uVar11 + *puVar10;
      puVar10 = puVar10 + 1;
    } while (puVar10 != next->_data + next->_size);
    iVar7 = uVar11 - 1;
  }
  bVar4 = (&DAT_00196638)[uVar13 | cVar5 == cVar3];
  paVar2 = &local_b8._msg.field_2;
  local_b8._msg._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_e8._data);
  local_b8._file._0_7_ = local_c8;
  local_b8._40_3_ = SUB43(CONCAT13(uStack_be,CONCAT21(uStack_c0,uStack_c1)) >> 8,0);
  local_b8._file._7_1_ = uStack_c1;
  Result::Result(__return_storage_ptr__,&txt,rowNumber,local_134,iVar7,Code39,
                 (SymbologyIdentifier)((uint)bVar4 << 8 | 0x41),&local_b8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._msg._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._msg._M_dataplus._M_p,local_b8._msg.field_2._M_allocated_capacity + 1);
  }
  if ((Iterator *)local_e8._data != &local_e8._base) {
    operator_delete(local_e8._data,CONCAT71(local_e8._base._1_7_,local_e8._base._0_1_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fullASCII._M_dataplus._M_p != &fullASCII.field_2) {
    operator_delete(fullASCII._M_dataplus._M_p,fullASCII.field_2._M_allocated_capacity + 1);
  }
LAB_0015bb37:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p == &txt.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(txt._M_dataplus._M_p,
                  CONCAT71(txt.field_2._M_allocated_capacity._1_7_,txt.field_2._M_local_buf[0]) + 1)
  ;
  return __return_storage_ptr__;
}

Assistant:

Barcode Code39Reader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<RowReader::DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	int minCharCount = _opts.validateCode39CheckSum() ? 4 : 3;
	auto isStartOrStopSymbol = [](char c) { return c == '*'; };

	// provide the indices with the narrow bars/spaces which have to be equally wide
	constexpr auto START_PATTERN = FixedSparcePattern<CHAR_LEN, 6>{0, 2, 3, 5, 7, 8};
	// quiet zone is half the width of a character symbol
	constexpr float QUIET_ZONE_SCALE = 0.5f;

	next = FindLeftGuard(next, minCharCount * CHAR_LEN, START_PATTERN, QUIET_ZONE_SCALE * 12);
	if (!next.isValid())
		return {};

	if (!isStartOrStopSymbol(DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET))) // read off the start pattern
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	txt.pop_back(); // remove asterisk

	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount - 2 || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	auto lastChar = txt.back();
	txt.pop_back();
	int checksum = TransformReduce(txt, 0, [](char c) { return IndexOf(ALPHABET, c); });
	bool hasValidCheckSum = lastChar == ALPHABET[checksum % 43];
	if (!hasValidCheckSum)
		txt.push_back(lastChar);

	const char shiftChars[] = "$%/+";
	auto fullASCII = _opts.tryCode39ExtendedMode() ? DecodeCode39AndCode93FullASCII(txt, shiftChars) : "";
	bool hasFullASCII = !fullASCII.empty() && std::find_first_of(txt.begin(), txt.end(), shiftChars, shiftChars + 4) != txt.end();
	if (hasFullASCII)
		txt = fullASCII;

	if (hasValidCheckSum)
		txt.push_back(lastChar);

	Error error = _opts.validateCode39CheckSum() && !hasValidCheckSum ? ChecksumError() : Error();

	// Symbology identifier modifiers ISO/IEC 16388:2007 Annex C Table C.1
	constexpr const char symbologyModifiers[4] = { '0', '1' /*checksum*/, '4' /*full ASCII*/, '5' /*checksum + full ASCII*/ };
	SymbologyIdentifier symbologyIdentifier = {'A', symbologyModifiers[(int)hasValidCheckSum + 2 * (int)hasFullASCII]};

	int xStop = next.pixelsTillEnd();
	return {std::move(txt), rowNumber, xStart, xStop, BarcodeFormat::Code39, symbologyIdentifier, error};
}